

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

double __thiscall
soplex::SPxScaler<double>::lhsUnscaled(SPxScaler<double> *this,SPxLPBase<double> *lp,int i)

{
  double dVar1;
  double *pdVar2;
  int in_EDX;
  long in_RSI;
  DataArray<int> *rowscaleExp;
  undefined8 in_stack_ffffffffffffffc8;
  int i_00;
  LPRowSetBase<double> *in_stack_ffffffffffffffd0;
  LPRowSetBase<double> *this_00;
  undefined8 local_8;
  
  i_00 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  pdVar2 = LPRowSetBase<double>::lhs(in_stack_ffffffffffffffd0,i_00);
  this_00 = (LPRowSetBase<double> *)*pdVar2;
  pdVar2 = (double *)infinity();
  if ((double)this_00 <= -*pdVar2) {
    pdVar2 = LPRowSetBase<double>::lhs(this_00,i_00);
    local_8 = *pdVar2;
  }
  else {
    pdVar2 = LPRowSetBase<double>::lhs(this_00,i_00);
    dVar1 = *pdVar2;
    DataArray<int>::operator[]((DataArray<int> *)(in_RSI + 0xb0),in_EDX);
    local_8 = spxLdexp((Real)this_00,(int)((ulong)dVar1 >> 0x20));
  }
  return local_8;
}

Assistant:

R SPxScaler<R>::lhsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(lp.isScaled());
   assert(i < lp.nRows());
   assert(i >= 0);

   if(lp.LPRowSetBase<R>::lhs(i) > R(-infinity))
   {
      const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;
      return spxLdexp(lp.LPRowSetBase<R>::lhs(i), -rowscaleExp[i]);
   }
   else
      return lp.LPRowSetBase<R>::lhs(i);
}